

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode Curl_auth_create_digest_md5_message
                   (Curl_easy *data,char *chlg64,char *userp,char *passwdp,char *service,
                   char **outptr,size_t *outlen)

{
  int iVar1;
  uint uVar2;
  MD5_context *pMVar3;
  size_t sVar4;
  uchar *data_00;
  char *inputbuff;
  char *spn;
  undefined1 local_28f;
  uchar auStack_28e [3];
  char qop [5];
  char method [13];
  char nonceCount [9];
  char cnonce [33];
  uint local_24c;
  char local_248 [4];
  int qop_values;
  char qop_options [64];
  char algorithm [64];
  char realm [128];
  char nonce [64];
  char resp_hash_hex [33];
  uchar local_d8 [8];
  char HA2_hex [33];
  uchar local_a8 [8];
  char HA1_hex [33];
  byte local_78 [8];
  uchar digest [16];
  char *response;
  MD5_context *ctxt;
  size_t i;
  CURLcode result;
  char **outptr_local;
  char *service_local;
  char *passwdp_local;
  char *userp_local;
  char *chlg64_local;
  Curl_easy *data_local;
  
  builtin_strncpy(method + 5,"00000001",8);
  nonceCount[0] = '\0';
  auStack_28e[0] = 'A';
  auStack_28e[1] = 'U';
  auStack_28e[2] = 'T';
  builtin_strncpy(qop,"HENTI",5);
  builtin_strncpy(method,"CATE",5);
  stack0xfffffffffffffd6d = 0x68747561;
  local_28f = 0;
  data_local._4_4_ =
       auth_decode_digest_md5_message
                 (chlg64,realm + 0x78,0x40,algorithm + 0x38,0x80,qop_options + 0x38,0x40,local_248,
                  0x40);
  if (data_local._4_4_ == CURLE_OK) {
    iVar1 = strcmp(qop_options + 0x38,"md5-sess");
    if (iVar1 == 0) {
      data_local._4_4_ = auth_digest_get_qop_values(local_248,(int *)&local_24c);
      if (data_local._4_4_ == CURLE_OK) {
        if ((local_24c & 1) == 0) {
          data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
        }
        else {
          data_local._4_4_ = Curl_rand_hex(data,(uchar *)(nonceCount + 1),0x21);
          if (data_local._4_4_ == CURLE_OK) {
            pMVar3 = Curl_MD5_init(Curl_DIGEST_MD5);
            if (pMVar3 == (MD5_context *)0x0) {
              data_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              sVar4 = strlen(userp);
              uVar2 = curlx_uztoui(sVar4);
              Curl_MD5_update(pMVar3,(uchar *)userp,uVar2);
              Curl_MD5_update(pMVar3,":",1);
              sVar4 = strlen(algorithm + 0x38);
              uVar2 = curlx_uztoui(sVar4);
              Curl_MD5_update(pMVar3,(uchar *)(algorithm + 0x38),uVar2);
              Curl_MD5_update(pMVar3,":",1);
              sVar4 = strlen(passwdp);
              uVar2 = curlx_uztoui(sVar4);
              Curl_MD5_update(pMVar3,(uchar *)passwdp,uVar2);
              Curl_MD5_final(pMVar3,local_78);
              pMVar3 = Curl_MD5_init(Curl_DIGEST_MD5);
              if (pMVar3 == (MD5_context *)0x0) {
                data_local._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                Curl_MD5_update(pMVar3,local_78,0x10);
                Curl_MD5_update(pMVar3,":",1);
                sVar4 = strlen(realm + 0x78);
                uVar2 = curlx_uztoui(sVar4);
                Curl_MD5_update(pMVar3,(uchar *)(realm + 0x78),uVar2);
                Curl_MD5_update(pMVar3,":",1);
                sVar4 = strlen(nonceCount + 1);
                uVar2 = curlx_uztoui(sVar4);
                Curl_MD5_update(pMVar3,(uchar *)(nonceCount + 1),uVar2);
                Curl_MD5_final(pMVar3,local_78);
                for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                    ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                  curl_msnprintf((char *)(local_a8 + (long)ctxt * 2),3,"%02x",
                                 (ulong)local_78[(long)ctxt]);
                }
                data_00 = (uchar *)Curl_auth_build_spn(service,algorithm + 0x38,(char *)0x0);
                if (data_00 == (uchar *)0x0) {
                  data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                }
                else {
                  pMVar3 = Curl_MD5_init(Curl_DIGEST_MD5);
                  if (pMVar3 == (MD5_context *)0x0) {
                    (*Curl_cfree)(data_00);
                    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                  }
                  else {
                    sVar4 = strlen((char *)auStack_28e);
                    uVar2 = curlx_uztoui(sVar4);
                    Curl_MD5_update(pMVar3,auStack_28e,uVar2);
                    Curl_MD5_update(pMVar3,":",1);
                    sVar4 = strlen((char *)data_00);
                    uVar2 = curlx_uztoui(sVar4);
                    Curl_MD5_update(pMVar3,data_00,uVar2);
                    Curl_MD5_final(pMVar3,local_78);
                    for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                        ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                      curl_msnprintf((char *)(local_d8 + (long)ctxt * 2),3,"%02x",
                                     (ulong)local_78[(long)ctxt]);
                    }
                    pMVar3 = Curl_MD5_init(Curl_DIGEST_MD5);
                    if (pMVar3 == (MD5_context *)0x0) {
                      (*Curl_cfree)(data_00);
                      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                    }
                    else {
                      Curl_MD5_update(pMVar3,local_a8,0x20);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen(realm + 0x78);
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)(realm + 0x78),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen(method + 5);
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)(method + 5),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen(nonceCount + 1);
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)(nonceCount + 1),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen((char *)((long)&spn + 5));
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)((long)&spn + 5),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      Curl_MD5_update(pMVar3,local_d8,0x20);
                      Curl_MD5_final(pMVar3,local_78);
                      for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                          ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                        curl_msnprintf(resp_hash_hex + (long)ctxt * 2 + -8,3,"%02x",
                                       (ulong)local_78[(long)ctxt]);
                      }
                      inputbuff = curl_maprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\",cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,qop=%s"
                                                ,userp,algorithm + 0x38,realm + 0x78,nonceCount + 1,
                                                method + 5,data_00,nonce + 0x38,(long)&spn + 5);
                      (*Curl_cfree)(data_00);
                      if (inputbuff == (char *)0x0) {
                        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                      }
                      else {
                        data_local._4_4_ = Curl_base64_encode(data,inputbuff,0,outptr,outlen);
                        (*Curl_cfree)(inputbuff);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_digest_md5_message(struct Curl_easy *data,
                                             const char *chlg64,
                                             const char *userp,
                                             const char *passwdp,
                                             const char *service,
                                             char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t i;
  MD5_context *ctxt;
  char *response = NULL;
  unsigned char digest[MD5_DIGEST_LEN];
  char HA1_hex[2 * MD5_DIGEST_LEN + 1];
  char HA2_hex[2 * MD5_DIGEST_LEN + 1];
  char resp_hash_hex[2 * MD5_DIGEST_LEN + 1];
  char nonce[64];
  char realm[128];
  char algorithm[64];
  char qop_options[64];
  int qop_values;
  char cnonce[33];
  char nonceCount[] = "00000001";
  char method[]     = "AUTHENTICATE";
  char qop[]        = DIGEST_QOP_VALUE_STRING_AUTH;
  char *spn         = NULL;

  /* Decode the challenge message */
  result = auth_decode_digest_md5_message(chlg64, nonce, sizeof(nonce),
                                          realm, sizeof(realm),
                                          algorithm, sizeof(algorithm),
                                          qop_options, sizeof(qop_options));
  if(result)
    return result;

  /* We only support md5 sessions */
  if(strcmp(algorithm, "md5-sess") != 0)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Get the qop-values from the qop-options */
  result = auth_digest_get_qop_values(qop_options, &qop_values);
  if(result)
    return result;

  /* We only support auth quality-of-protection */
  if(!(qop_values & DIGEST_QOP_VALUE_AUTH))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Generate 32 random hex chars, 32 bytes + 1 zero termination */
  result = Curl_rand_hex(data, (unsigned char *)cnonce, sizeof(cnonce));
  if(result)
    return result;

  /* So far so good, now calculate A1 and H(A1) according to RFC 2831 */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) userp,
                  curlx_uztoui(strlen(userp)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) realm,
                  curlx_uztoui(strlen(realm)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) passwdp,
                  curlx_uztoui(strlen(passwdp)));
  Curl_MD5_final(ctxt, digest);

  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) digest, MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_final(ctxt, digest);

  /* Convert calculated 16 octet hex into 32 bytes string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&HA1_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate our SPN */
  spn = Curl_auth_build_spn(service, realm, NULL);
  if(!spn)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate H(A2) */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) method,
                  curlx_uztoui(strlen(method)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) spn,
                  curlx_uztoui(strlen(spn)));
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&HA2_hex[2 * i], 3, "%02x", digest[i]);

  /* Now calculate the response hash */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) HA1_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) nonceCount,
                  curlx_uztoui(strlen(nonceCount)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) qop,
                  curlx_uztoui(strlen(qop)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) HA2_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&resp_hash_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate the response */
  response = aprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\","
                     "cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,"
                     "qop=%s",
                     userp, realm, nonce,
                     cnonce, nonceCount, spn, resp_hash_hex, qop);
  free(spn);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the response */
  result = Curl_base64_encode(data, response, 0, outptr, outlen);

  free(response);

  return result;
}